

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_bf7da7::HandleGenerateCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  string *condition_00;
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *outputExpr;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  *pcVar6;
  cmArgumentParser<Arguments> *pcVar7;
  cmMakefile *mf;
  const_reference pvVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  reference arg;
  ostream *poVar11;
  reference pvVar12;
  static_string_view sVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_930;
  bool local_8d1;
  string local_7a8;
  string local_788;
  uint local_764;
  undefined1 local_760 [4];
  uint i;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  const_iterator __end2;
  const_iterator __begin2;
  NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  invalidOptions;
  mode_t permissions;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  allocator<char> local_531;
  string local_530;
  string local_510;
  undefined1 local_4f0 [8];
  string errorMessage;
  undefined1 local_4c8 [4];
  cmNewLineStyle newLineStyle;
  string *target;
  string local_498;
  string local_478;
  string *local_458;
  string *condition;
  string local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_428;
  string *input;
  string local_418;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_3f8;
  size_t local_3e8;
  char *local_3e0;
  basic_string_view<char,_std::char_traits<char>_> local_3d8;
  basic_string_view<char,_std::char_traits<char>_> local_3c8;
  size_t local_3b8;
  char *pcStack_3b0;
  byte local_39a;
  allocator<char> local_399;
  undefined1 local_398 [6];
  bool inputIsContent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_378;
  string *output;
  string local_368;
  basic_string_view<char,_std::char_traits<char>_> local_348;
  basic_string_view<char,_std::char_traits<char>_> local_338;
  size_t local_328;
  char *pcStack_320;
  allocator<char> local_311;
  string local_310;
  uint local_2ec;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_2e8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_2d8;
  undefined1 local_2c8 [8];
  Arguments arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  cmArgumentParser<Arguments> local_c8;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar2 = local_20;
  if (sVar5 < 5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Incorrect arguments to GENERATE subcommand.",&local_41);
    cmExecutionStatus::SetError(pcVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
    goto LAB_0067c7e0;
  }
  if (((anonymous_namespace)::
       HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar4 != 0)) {
    local_c8.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
    local_c8.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
    local_c8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager = (_Manager_type)0x0;
    local_c8.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
    local_c8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused._M_object =
         (void *)0x0;
    local_c8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
    local_c8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
         (_Manager_type)0x0;
    local_c8.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
    _M_object = (void *)0x0;
    local_c8.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmArgumentParser<Arguments>::cmArgumentParser(&local_c8);
    sVar13 = ::cm::operator____s("OUTPUT",6);
    pcVar6 = (cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::Bind<std::optional<std::__cxx11::string>>
                          ((cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                            *)&local_c8,sVar13,0x30);
    sVar13 = ::cm::operator____s("INPUT",5);
    pcVar6 = (cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::Bind<std::optional<std::__cxx11::string>>(pcVar6,sVar13,0x58);
    sVar13 = ::cm::operator____s("CONTENT",7);
    pcVar6 = (cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::Bind<std::optional<std::__cxx11::string>>(pcVar6,sVar13,0x80);
    sVar13 = ::cm::operator____s("CONDITION",9);
    pcVar6 = (cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::Bind<std::optional<std::__cxx11::string>>(pcVar6,sVar13,0xa8);
    sVar13 = ::cm::operator____s("TARGET",6);
    pcVar7 = cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
             ::Bind<std::optional<std::__cxx11::string>>(pcVar6,sVar13,0xd0);
    sVar13 = ::cm::operator____s("NO_SOURCE_PERMISSIONS",0x15);
    pcVar7 = cmArgumentParser<Arguments>::Bind<bool>(pcVar7,sVar13,0x120);
    sVar13 = ::cm::operator____s("USE_SOURCE_PERMISSIONS",0x16);
    pcVar6 = (cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<Arguments>::Bind<bool>(pcVar7,sVar13,0x121);
    sVar13 = ::cm::operator____s("FILE_PERMISSIONS",0x10);
    pcVar6 = (cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::
                Bind<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          (pcVar6,sVar13,0x128);
    sVar13 = ::cm::operator____s("NEWLINE_STYLE",0xd);
    pcVar7 = cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
             ::Bind<std::optional<std::__cxx11::string>>(pcVar6,sVar13,0xf8);
    pcVar7 = cmArgumentParser<Arguments>::BindParsedKeywords(pcVar7,0x140);
    cmArgumentParser<Arguments>::cmArgumentParser(&HandleGenerateCommand::parser,pcVar7);
    cmArgumentParser<Arguments>::~cmArgumentParser(&local_c8);
    __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&HandleGenerateCommand::parser,
                 &__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&arguments.ParsedKeywords.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_2e8 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local);
  local_2d8 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::advance(&local_2e8,1);
  cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Arguments *)local_2c8,
             (cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)&HandleGenerateCommand::parser,&local_2d8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&arguments.ParsedKeywords.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  mf = cmExecutionStatus::GetMakefile(local_20);
  bVar3 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_2c8,mf);
  if (bVar3) {
    args_local._7_1_ = 1;
    local_2ec = 1;
  }
  else {
    bVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&arguments.ParsedKeywords.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pcVar2 = local_20;
    if (bVar3) {
      bVar3 = std::optional::operator_cast_to_bool
                        ((optional *)
                         &arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                          super__Rb_tree_header._M_node_count);
      local_8d1 = true;
      if (bVar3) {
        pvVar8 = std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)&arguments.FilePermissions.
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        local_328 = pvVar8->_M_len;
        pcStack_320 = pvVar8->_M_str;
        local_348 = (basic_string_view<char,_std::char_traits<char>_>)
                    ::cm::operator____s("OUTPUT",6);
        __x_01._M_str = pcStack_320;
        __x_01._M_len = local_328;
        local_338 = local_348;
        local_8d1 = std::operator!=(__x_01,local_348);
      }
      pcVar2 = local_20;
      if (local_8d1 == false) {
        local_378 = std::
                    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                                    super__Rb_tree_header._M_node_count);
        bVar3 = std::optional::operator_cast_to_bool
                          ((optional *)
                           &arguments.Output.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_engaged);
        if (!bVar3) {
          bVar3 = std::optional::operator_cast_to_bool
                            ((optional *)
                             &arguments.Input.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_engaged);
          pcVar2 = local_20;
          if (!bVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_398,"GENERATE requires INPUT or CONTENT option.",&local_399);
            cmExecutionStatus::SetError(pcVar2,(string *)local_398);
            std::__cxx11::string::~string((string *)local_398);
            std::allocator<char>::~allocator(&local_399);
            args_local._7_1_ = 0;
            local_2ec = 1;
            goto LAB_0067c7ac;
          }
        }
        pvVar8 = std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)&arguments.FilePermissions.
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
        local_3b8 = pvVar8->_M_len;
        pcStack_3b0 = pvVar8->_M_str;
        local_3d8 = (basic_string_view<char,_std::char_traits<char>_>)
                    ::cm::operator____s("CONTENT",7);
        __x_00._M_str = pcStack_3b0;
        __x_00._M_len = local_3b8;
        local_3c8 = local_3d8;
        local_39a = std::operator==(__x_00,local_3d8);
        if (!(bool)local_39a) {
          pvVar8 = std::
                   vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 *)&arguments.FilePermissions.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
          local_3e8 = pvVar8->_M_len;
          local_3e0 = pvVar8->_M_str;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_3f8,"INPUT");
          __x._M_str = local_3e0;
          __x._M_len = local_3e8;
          bVar3 = std::operator!=(__x,local_3f8);
          pcVar2 = local_20;
          if (bVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_418,"Unknown argument to GENERATE subcommand.",
                       (allocator<char> *)((long)&input + 7));
            cmExecutionStatus::SetError(pcVar2,&local_418);
            std::__cxx11::string::~string((string *)&local_418);
            std::allocator<char>::~allocator((allocator<char> *)((long)&input + 7));
            args_local._7_1_ = 0;
            local_2ec = 1;
            goto LAB_0067c7ac;
          }
        }
        if ((local_39a & 1) == 0) {
          local_930 = std::
                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&arguments.Output.
                                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ._M_engaged);
        }
        else {
          local_930 = std::
                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&arguments.Input.
                                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ._M_engaged);
        }
        local_428 = local_930;
        bVar3 = std::optional::operator_cast_to_bool
                          ((optional *)
                           &arguments.Content.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_engaged);
        if (bVar3) {
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&arguments.Content.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_engaged);
          uVar9 = std::__cxx11::string::empty();
          pcVar2 = local_20;
          if ((uVar9 & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_448,
                       "CONDITION of sub-command GENERATE must not be empty if specified.",
                       (allocator<char> *)((long)&condition + 7));
            cmExecutionStatus::SetError(pcVar2,&local_448);
            std::__cxx11::string::~string((string *)&local_448);
            std::allocator<char>::~allocator((allocator<char> *)((long)&condition + 7));
            args_local._7_1_ = 0;
            local_2ec = 1;
            goto LAB_0067c7ac;
          }
        }
        bVar3 = std::optional::operator_cast_to_bool
                          ((optional *)
                           &arguments.Content.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_engaged);
        if (bVar3) {
          pbVar10 = std::
                    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&arguments.Content.
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_engaged);
          std::__cxx11::string::string((string *)&local_478,(string *)pbVar10);
        }
        else {
          std::__cxx11::string::string((string *)&local_478);
        }
        local_458 = &local_478;
        bVar3 = std::optional::operator_cast_to_bool
                          ((optional *)
                           &arguments.Condition.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_engaged);
        if (bVar3) {
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&arguments.Condition.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_engaged);
          uVar9 = std::__cxx11::string::empty();
          pcVar2 = local_20;
          if ((uVar9 & 1) == 0) goto LAB_0067be60;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_498,
                     "TARGET of sub-command GENERATE must not be empty if specified.",
                     (allocator<char> *)((long)&target + 7));
          cmExecutionStatus::SetError(pcVar2,&local_498);
          std::__cxx11::string::~string((string *)&local_498);
          std::allocator<char>::~allocator((allocator<char> *)((long)&target + 7));
          args_local._7_1_ = 0;
          local_2ec = 1;
        }
        else {
LAB_0067be60:
          bVar3 = std::optional::operator_cast_to_bool
                            ((optional *)
                             &arguments.Condition.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_engaged);
          if (bVar3) {
            pbVar10 = std::
                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&arguments.Condition.
                                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ._M_engaged);
            std::__cxx11::string::string((string *)local_4c8,(string *)pbVar10);
          }
          else {
            std::__cxx11::string::string((string *)local_4c8);
          }
          cmNewLineStyle::cmNewLineStyle((cmNewLineStyle *)((long)&errorMessage.field_2 + 0xc));
          bVar3 = std::optional::operator_cast_to_bool
                            ((optional *)
                             &arguments.Target.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_engaged);
          if (bVar3) {
            std::__cxx11::string::string((string *)local_4f0);
            bVar3 = cmNewLineStyle::ReadFromArguments
                              ((cmNewLineStyle *)((long)&errorMessage.field_2 + 0xc),
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)status_local,(string *)local_4f0);
            pcVar2 = local_20;
            if (!bVar3) {
              cmStrCat<char_const(&)[10],std::__cxx11::string&>
                        (&local_510,(char (*) [10])"GENERATE ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4f0);
              cmExecutionStatus::SetError(pcVar2,&local_510);
              std::__cxx11::string::~string((string *)&local_510);
              args_local._7_1_ = 0;
            }
            local_2ec = (uint)!bVar3;
            std::__cxx11::string::~string((string *)local_4f0);
            if (local_2ec == 0) goto LAB_0067bff9;
          }
          else {
LAB_0067bff9:
            pcVar2 = local_20;
            if (((arguments.NewLineStyle.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_engaged & 1U) == 0) ||
               ((arguments.NewLineStyle.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._33_1_ & 1) == 0)) {
              bVar3 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&arguments.NoSourcePermissions);
              pcVar2 = local_20;
              if (bVar3) {
LAB_0067c25d:
                if (((arguments.NewLineStyle.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._33_1_ & 1) == 0) || ((local_39a & 1) == 0)) {
                  invalidOptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  if ((arguments.NewLineStyle.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_engaged & 1U) != 0) {
                    invalidOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x1a4;
                  }
                  bVar3 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&arguments.NoSourcePermissions);
                  if (!bVar3) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&__range2);
                    __end2 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&arguments.NoSourcePermissions);
                    e = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&arguments.NoSourcePermissions);
                    while( true ) {
                      bVar3 = __gnu_cxx::operator!=
                                        (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&e);
                      if (!bVar3) break;
                      arg = __gnu_cxx::
                            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator*(&__end2);
                      bVar3 = cmFSPermissions::stringToModeT
                                        (arg,(mode_t *)
                                             &invalidOptions.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      if (!bVar3) {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&__range2,arg);
                      }
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++(&__end2);
                    }
                    bVar3 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&__range2);
                    if (bVar3) {
                      local_2ec = 0;
                    }
                    else {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_760);
                      std::operator<<((ostream *)local_760,"given invalid permission ");
                      local_764 = 0;
                      while( true ) {
                        uVar9 = (ulong)local_764;
                        sVar5 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&__range2);
                        if (sVar5 <= uVar9) break;
                        if (local_764 == 0) {
                          poVar11 = std::operator<<((ostream *)local_760,"\"");
                          pvVar12 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&__range2,(ulong)local_764);
                          poVar11 = std::operator<<(poVar11,(string *)pvVar12);
                          std::operator<<(poVar11,"\"");
                        }
                        else {
                          poVar11 = std::operator<<((ostream *)local_760,",\"");
                          pvVar12 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&__range2,(ulong)local_764);
                          poVar11 = std::operator<<(poVar11,(string *)pvVar12);
                          std::operator<<(poVar11,"\"");
                        }
                        local_764 = local_764 + 1;
                      }
                      std::operator<<((ostream *)local_760,".");
                      pcVar2 = local_20;
                      std::__cxx11::ostringstream::str();
                      cmExecutionStatus::SetError(pcVar2,&local_788);
                      std::__cxx11::string::~string((string *)&local_788);
                      args_local._7_1_ = 0;
                      local_2ec = 1;
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_760);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&__range2);
                    if (local_2ec != 0) goto LAB_0067c774;
                  }
                  outputExpr = local_378;
                  bVar1 = local_39a;
                  pbVar10 = local_428;
                  condition_00 = local_458;
                  cmNewLineStyle::GetCharacters_abi_cxx11_
                            (&local_7a8,(cmNewLineStyle *)((long)&errorMessage.field_2 + 0xc));
                  AddEvaluationFile(pbVar10,(string *)local_4c8,outputExpr,condition_00,
                                    (bool)(bVar1 & 1),&local_7a8,
                                    (mode_t)invalidOptions.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    local_20);
                  std::__cxx11::string::~string((string *)&local_7a8);
                  args_local._7_1_ = 1;
                  local_2ec = 1;
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&permissions,
                             "given USE_SOURCE_PERMISSIONS without a file INPUT.",
                             (allocator<char> *)
                             ((long)&invalidOptions.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                  cmExecutionStatus::SetError(pcVar2,(string *)&permissions);
                  std::__cxx11::string::~string((string *)&permissions);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)
                             ((long)&invalidOptions.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                  args_local._7_1_ = 0;
                  local_2ec = 1;
                }
              }
              else if ((arguments.NewLineStyle.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_engaged & 1U) == 0) {
                if ((arguments.NewLineStyle.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._33_1_ & 1) == 0) goto LAB_0067c25d;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_580,
                           "given both USE_SOURCE_PERMISSIONS and FILE_PERMISSIONS. Only one option allowed."
                           ,&local_581);
                cmExecutionStatus::SetError(pcVar2,&local_580);
                std::__cxx11::string::~string((string *)&local_580);
                std::allocator<char>::~allocator(&local_581);
                args_local._7_1_ = 0;
                local_2ec = 1;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_558,
                           "given both NO_SOURCE_PERMISSIONS and FILE_PERMISSIONS. Only one option allowed."
                           ,&local_559);
                cmExecutionStatus::SetError(pcVar2,&local_558);
                std::__cxx11::string::~string((string *)&local_558);
                std::allocator<char>::~allocator(&local_559);
                args_local._7_1_ = 0;
                local_2ec = 1;
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_530,
                         "given both NO_SOURCE_PERMISSIONS and USE_SOURCE_PERMISSIONS. Only one option allowed."
                         ,&local_531);
              cmExecutionStatus::SetError(pcVar2,&local_530);
              std::__cxx11::string::~string((string *)&local_530);
              std::allocator<char>::~allocator(&local_531);
              args_local._7_1_ = 0;
              local_2ec = 1;
            }
          }
LAB_0067c774:
          std::__cxx11::string::~string((string *)local_4c8);
        }
        std::__cxx11::string::~string((string *)&local_478);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_368,"GENERATE requires OUTPUT as first option.",
                   (allocator<char> *)((long)&output + 7));
        cmExecutionStatus::SetError(pcVar2,&local_368);
        std::__cxx11::string::~string((string *)&local_368);
        std::allocator<char>::~allocator((allocator<char> *)((long)&output + 7));
        args_local._7_1_ = 0;
        local_2ec = 1;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"Unknown argument to GENERATE subcommand.",&local_311);
      cmExecutionStatus::SetError(pcVar2,&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      std::allocator<char>::~allocator(&local_311);
      args_local._7_1_ = 0;
      local_2ec = 1;
    }
  }
LAB_0067c7ac:
  HandleGenerateCommand::Arguments::~Arguments((Arguments *)local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&arguments.ParsedKeywords.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_0067c7e0:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleGenerateCommand(std::vector<std::string> const& args,
                           cmExecutionStatus& status)
{
  if (args.size() < 5) {
    status.SetError("Incorrect arguments to GENERATE subcommand.");
    return false;
  }

  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<std::string> Output;
    cm::optional<std::string> Input;
    cm::optional<std::string> Content;
    cm::optional<std::string> Condition;
    cm::optional<std::string> Target;
    cm::optional<std::string> NewLineStyle;
    bool NoSourcePermissions = false;
    bool UseSourcePermissions = false;
    ArgumentParser::NonEmpty<std::vector<std::string>> FilePermissions;
    std::vector<cm::string_view> ParsedKeywords;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("OUTPUT"_s, &Arguments::Output)
      .Bind("INPUT"_s, &Arguments::Input)
      .Bind("CONTENT"_s, &Arguments::Content)
      .Bind("CONDITION"_s, &Arguments::Condition)
      .Bind("TARGET"_s, &Arguments::Target)
      .Bind("NO_SOURCE_PERMISSIONS"_s, &Arguments::NoSourcePermissions)
      .Bind("USE_SOURCE_PERMISSIONS"_s, &Arguments::UseSourcePermissions)
      .Bind("FILE_PERMISSIONS"_s, &Arguments::FilePermissions)
      .Bind("NEWLINE_STYLE"_s, &Arguments::NewLineStyle)
      .BindParsedKeywords(&Arguments::ParsedKeywords);

  std::vector<std::string> unparsedArguments;
  Arguments const arguments =
    parser.Parse(cmMakeRange(args).advance(1), &unparsedArguments);

  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  if (!unparsedArguments.empty()) {
    status.SetError("Unknown argument to GENERATE subcommand.");
    return false;
  }

  if (!arguments.Output || arguments.ParsedKeywords[0] != "OUTPUT"_s) {
    status.SetError("GENERATE requires OUTPUT as first option.");
    return false;
  }
  std::string const& output = *arguments.Output;

  if (!arguments.Input && !arguments.Content) {
    status.SetError("GENERATE requires INPUT or CONTENT option.");
    return false;
  }
  const bool inputIsContent = arguments.ParsedKeywords[1] == "CONTENT"_s;
  if (!inputIsContent && arguments.ParsedKeywords[1] != "INPUT") {
    status.SetError("Unknown argument to GENERATE subcommand.");
    return false;
  }
  std::string const& input =
    inputIsContent ? *arguments.Content : *arguments.Input;

  if (arguments.Condition && arguments.Condition->empty()) {
    status.SetError("CONDITION of sub-command GENERATE must not be empty "
                    "if specified.");
    return false;
  }
  std::string const& condition =
    arguments.Condition ? *arguments.Condition : std::string();

  if (arguments.Target && arguments.Target->empty()) {
    status.SetError("TARGET of sub-command GENERATE must not be empty "
                    "if specified.");
    return false;
  }
  std::string const& target =
    arguments.Target ? *arguments.Target : std::string();

  cmNewLineStyle newLineStyle;
  if (arguments.NewLineStyle) {
    std::string errorMessage;
    if (!newLineStyle.ReadFromArguments(args, errorMessage)) {
      status.SetError(cmStrCat("GENERATE ", errorMessage));
      return false;
    }
  }

  if (arguments.NoSourcePermissions && arguments.UseSourcePermissions) {
    status.SetError("given both NO_SOURCE_PERMISSIONS and "
                    "USE_SOURCE_PERMISSIONS. Only one option allowed.");
    return false;
  }

  if (!arguments.FilePermissions.empty()) {
    if (arguments.NoSourcePermissions) {
      status.SetError("given both NO_SOURCE_PERMISSIONS and "
                      "FILE_PERMISSIONS. Only one option allowed.");
      return false;
    }
    if (arguments.UseSourcePermissions) {
      status.SetError("given both USE_SOURCE_PERMISSIONS and "
                      "FILE_PERMISSIONS. Only one option allowed.");
      return false;
    }
  }

  if (arguments.UseSourcePermissions) {
    if (inputIsContent) {
      status.SetError("given USE_SOURCE_PERMISSIONS without a file INPUT.");
      return false;
    }
  }

  mode_t permissions = 0;
  if (arguments.NoSourcePermissions) {
    permissions |= cmFSPermissions::mode_owner_read;
    permissions |= cmFSPermissions::mode_owner_write;
    permissions |= cmFSPermissions::mode_group_read;
    permissions |= cmFSPermissions::mode_world_read;
  }

  if (!arguments.FilePermissions.empty()) {
    std::vector<std::string> invalidOptions;
    for (auto const& e : arguments.FilePermissions) {
      if (!cmFSPermissions::stringToModeT(e, permissions)) {
        invalidOptions.push_back(e);
      }
    }
    if (!invalidOptions.empty()) {
      std::ostringstream oss;
      oss << "given invalid permission ";
      for (auto i = 0u; i < invalidOptions.size(); i++) {
        if (i == 0u) {
          oss << "\"" << invalidOptions[i] << "\"";
        } else {
          oss << ",\"" << invalidOptions[i] << "\"";
        }
      }
      oss << ".";
      status.SetError(oss.str());
      return false;
    }
  }

  AddEvaluationFile(input, target, output, condition, inputIsContent,
                    newLineStyle.GetCharacters(), permissions, status);
  return true;
}